

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_prov.c
# Opt level: O0

int set_flag(OSSL_PARAM *params,char *key,int mask,int *flags)

{
  int iVar1;
  OSSL_PARAM *p_00;
  uint *in_RCX;
  uint in_EDX;
  int flag;
  OSSL_PARAM *p;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  OSSL_PARAM *in_stack_ffffffffffffffd0;
  
  p_00 = OSSL_PARAM_locate_const
                   (in_stack_ffffffffffffffd0,
                    (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar2 = 0;
  if (p_00 != (OSSL_PARAM *)0x0) {
    iVar1 = OSSL_PARAM_get_int(p_00,(int *)(ulong)in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      return 0;
    }
    if (iVar2 == 0) {
      *in_RCX = (in_EDX ^ 0xffffffff) & *in_RCX;
    }
    else {
      *in_RCX = in_EDX | *in_RCX;
    }
  }
  return 1;
}

Assistant:

static int set_flag(const OSSL_PARAM params[], const char *key, int mask,
                    int *flags)
{
    const OSSL_PARAM *p = OSSL_PARAM_locate_const(params, key);
    int flag = 0;

    if (p != NULL) {
        if (!OSSL_PARAM_get_int(p, &flag))
            return 0;
        if (flag == 0)
            *flags &= ~mask;
        else
            *flags |= mask;
    }
    return 1;
}